

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall Editor::openBoard(Editor *this,bool ignoreUnsaved,path *filename)

{
  format_string_t<ghc::filesystem::path_&> fmt;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte in_SIL;
  Editor *in_RDI;
  path *in_stack_00000080;
  bool in_stack_0000008f;
  EditorInterface *in_stack_00000090;
  path *in_stack_000000b0;
  Board *in_stack_000000b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  openResult;
  path openFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  Editor *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  format in_stack_fffffffffffffd14;
  char (*in_stack_fffffffffffffd18) [7];
  deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  *in_stack_fffffffffffffd20;
  allocator_type *in_stack_fffffffffffffd28;
  Editor *in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  Editor *pEVar2;
  size_type in_stack_fffffffffffffd40;
  basic_string_view<char> local_240;
  undefined4 local_22c;
  undefined1 local_1e5;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  string *local_1e0;
  undefined1 local_1d8 [64];
  string local_198 [32];
  string local_178 [32];
  Drawable in_stack_fffffffffffffea8;
  Drawable in_stack_fffffffffffffeb0;
  allocator local_c9;
  string local_c8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98 [5];
  byte local_19;
  char *local_10;
  basic_string_view<char> *local_8;
  
  local_19 = in_SIL & 1;
  if ((local_19 == 0) && (bVar1 = isEditUnsaved(in_RDI), bVar1)) {
    std::function<void()>::function<Editor::openBoard(bool,ghc::filesystem::path_const&)::__0,void>
              ((function<void_()> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd08);
    EditorInterface::showSaveDialog
              ((EditorInterface *)in_stack_fffffffffffffeb0._vptr_Drawable,
               (function<void_()> *)in_stack_fffffffffffffea8._vptr_Drawable);
    std::function<void_()>::~function((function<void_()> *)0x191d37);
    return;
  }
  ghc::filesystem::path::path((path *)0x191d6f);
  bVar1 = ghc::filesystem::path::empty((path *)0x191d7c);
  if (bVar1) {
    bVar1 = pfd::settings::available();
    if (!bVar1) {
      spdlog::warn<char[113]>((char (*) [113])0x1923b4);
      ghc::filesystem::path::path<char[7],ghc::filesystem::path>
                ((path *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd14);
      ghc::filesystem::operator/
                ((path *)in_stack_fffffffffffffd28,(path *)in_stack_fffffffffffffd20);
      EditorInterface::showFileDialog(in_stack_00000090,in_stack_0000008f,in_stack_00000080);
      ghc::filesystem::path::~path((path *)0x19242e);
      ghc::filesystem::path::~path((path *)0x19243b);
      local_22c = 1;
      goto LAB_0019258b;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Open",&local_c9);
    ghc::filesystem::path::path<char[7],ghc::filesystem::path>
              ((path *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd14
              );
    ghc::filesystem::operator/((path *)in_stack_fffffffffffffd28,(path *)in_stack_fffffffffffffd20);
    ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_fffffffffffffd08);
    local_1e5 = 1;
    local_1e0 = (string *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1d8,"Plain Text (*.txt)",&local_1e1);
    local_1e0 = (string *)(local_1d8 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1d8 + 0x20),"*.txt",&local_1e2);
    local_1e0 = local_198;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"All Files (*.*)",&local_1e3);
    local_1e0 = local_178;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"*",&local_1e4);
    local_1e5 = 0;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x191fb7);
    __l._M_len = in_stack_fffffffffffffd40;
    __l._M_array = in_stack_fffffffffffffd38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd30,__l,in_stack_fffffffffffffd28);
    pfd::open_file::open_file
              ((open_file *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcf8,none);
    pfd::open_file::result_abi_cxx11_((open_file *)in_stack_fffffffffffffcf8);
    pfd::open_file::~open_file((open_file *)0x192029);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x192043);
    pEVar2 = (Editor *)local_1d8;
    in_stack_fffffffffffffd30 = (Editor *)&stack0xfffffffffffffea8;
    do {
      in_stack_fffffffffffffd30 =
           (Editor *)
           &in_stack_fffffffffffffd30[-1].editHistory_.
            super__Deque_base<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffd30);
    } while (in_stack_fffffffffffffd30 != pEVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e4);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e3);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    ghc::filesystem::path::~path((path *)0x1920d0);
    ghc::filesystem::path::~path((path *)0x1920dd);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_98,0);
      ghc::filesystem::path::operator=((path *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  }
  else {
    ghc::filesystem::path::operator=
              ((path *)in_stack_fffffffffffffd00,(path *)in_stack_fffffffffffffcf8);
  }
  bVar1 = ghc::filesystem::path::empty((path *)0x1924a3);
  if (bVar1) {
    spdlog::info<char[18]>((char (*) [18])0x19257c);
  }
  else {
    deselectAll(in_stack_fffffffffffffd00);
    local_8 = &local_240;
    local_10 = "Loading \"{}\"...";
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_8,"Loading \"{}\"...",0xf);
    fmt.str.size_._0_4_ = in_stack_fffffffffffffd10;
    fmt.str.data_ = (char *)in_stack_fffffffffffffd08;
    fmt.str.size_._4_4_ = in_stack_fffffffffffffd14;
    spdlog::info<ghc::filesystem::path&>(fmt,(path *)in_stack_fffffffffffffd00);
    Board::loadFromFile(in_stack_000000b8,in_stack_000000b0);
    defaultZoom(in_stack_fffffffffffffd30);
    std::
    deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
    ::clear(in_stack_fffffffffffffd20);
    in_RDI->lastEditSize_ = 0;
    in_RDI->savedEditSize_ = 0;
  }
  local_22c = 0;
LAB_0019258b:
  ghc::filesystem::path::~path((path *)0x192598);
  return;
}

Assistant:

void Editor::openBoard(bool ignoreUnsaved, const fs::path& filename) {
    if (!ignoreUnsaved && isEditUnsaved()) {
        return interface_.showSaveDialog([this]() {
            openBoard(true);
        });
    }

    fs::path openFilename;
    if (!filename.empty()) {
        openFilename = filename;
    } else if (pfd::settings::available()) {
        auto openResult = pfd::open_file("Open", (workingDirectory_ / "boards").string(), {
            "Plain Text (*.txt)", "*.txt",
            "All Files (*.*)", "*"
        }, pfd::opt::none).result();

        if (!openResult.empty()) {
            openFilename = openResult[0];
        }
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(true, workingDirectory_ / "boards");
    }

    if (!openFilename.empty()) {
        deselectAll();
        spdlog::info("Loading \"{}\"...", openFilename);
        board_.loadFromFile(openFilename);
        defaultZoom();
        editHistory_.clear();
        lastEditSize_ = 0;
        savedEditSize_ = 0;
    } else {
        spdlog::info("No file selected.");
    }
}